

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Book *book)

{
  ostream *poVar1;
  string asStack_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)&book->title);
  poVar1 = std::operator<<(os,local_38);
  poVar1 = std::operator<<(poVar1,'\n');
  std::__cxx11::string::string(local_58,(string *)&book->author);
  poVar1 = std::operator<<(poVar1,local_58);
  poVar1 = std::operator<<(poVar1,'\n');
  std::__cxx11::string::string(asStack_78,(string *)&book->isbn);
  poVar1 = std::operator<<(poVar1,asStack_78);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string(asStack_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Book& book)
{
	os << book.get_title()
		<< '\n' << book.get_author()
		<< '\n' << book.get_isbn()
		<< '\n';
	return os;
}